

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkValidate.cpp
# Opt level: O0

int __thiscall glslang::TIntermediate::addXfbBufferOffset(TIntermediate *this,TType *type)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  reference this_01;
  uint *puVar3;
  size_type sVar4;
  reference pvVar5;
  int *piVar6;
  bool local_49;
  ulong local_48;
  size_t r;
  TRange range;
  uint size;
  TXfbBuffer *buffer;
  TQualifier *qualifier;
  TType *type_local;
  TIntermediate *this_local;
  TQualifier *this_00;
  
  iVar2 = (*type->_vptr_TType[0xb])();
  this_00 = (TQualifier *)CONCAT44(extraout_var,iVar2);
  bVar1 = TQualifier::hasXfbOffset(this_00);
  local_49 = false;
  if (bVar1) {
    local_49 = TQualifier::hasXfbBuffer(this_00);
  }
  if (local_49 != false) {
    this_01 = std::vector<glslang::TXfbBuffer,_std::allocator<glslang::TXfbBuffer>_>::operator[]
                        (&this->xfbBuffers,(ulong)((uint)*(undefined8 *)&this_00->field_0x24 & 0xf))
    ;
    range.last = computeTypeXfbSize(this,type,&this_01->contains64BitType,
                                    &this_01->contains32BitType,&this_01->contains16BitType);
    range.start = ((uint)(*(ulong *)&this_00->field_0x24 >> 0x12) & 0x1fff) + range.last;
    puVar3 = std::max<unsigned_int>(&this_01->implicitStride,(uint *)&range);
    this_01->implicitStride = *puVar3;
    TRange::TRange((TRange *)&r,(uint)(*(ulong *)&this_00->field_0x24 >> 0x12) & 0x1fff,
                   ((uint)(*(ulong *)&this_00->field_0x24 >> 0x12) & 0x1fff) + range.last + -1);
    local_48 = 0;
    while( true ) {
      sVar4 = std::vector<glslang::TRange,_std::allocator<glslang::TRange>_>::size(&this_01->ranges)
      ;
      if (sVar4 <= local_48) {
        std::vector<glslang::TRange,_std::allocator<glslang::TRange>_>::push_back
                  (&this_01->ranges,(value_type *)&r);
        return -1;
      }
      pvVar5 = std::vector<glslang::TRange,_std::allocator<glslang::TRange>_>::operator[]
                         (&this_01->ranges,local_48);
      bVar1 = TRange::overlap((TRange *)&r,pvVar5);
      if (bVar1) break;
      local_48 = local_48 + 1;
    }
    pvVar5 = std::vector<glslang::TRange,_std::allocator<glslang::TRange>_>::operator[]
                       (&this_01->ranges,local_48);
    piVar6 = std::max<int>((int *)&r,&pvVar5->start);
    return *piVar6;
  }
  __assert_fail("qualifier.hasXfbOffset() && qualifier.hasXfbBuffer()",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/linkValidate.cpp"
                ,0x80a,"int glslang::TIntermediate::addXfbBufferOffset(const TType &)");
}

Assistant:

int TIntermediate::addXfbBufferOffset(const TType& type)
{
    const TQualifier& qualifier = type.getQualifier();

    assert(qualifier.hasXfbOffset() && qualifier.hasXfbBuffer());
    TXfbBuffer& buffer = xfbBuffers[qualifier.layoutXfbBuffer];

    // compute the range
    unsigned int size = computeTypeXfbSize(type, buffer.contains64BitType, buffer.contains32BitType, buffer.contains16BitType);
    buffer.implicitStride = std::max(buffer.implicitStride, qualifier.layoutXfbOffset + size);
    TRange range(qualifier.layoutXfbOffset, qualifier.layoutXfbOffset + size - 1);

    // check for collisions
    for (size_t r = 0; r < buffer.ranges.size(); ++r) {
        if (range.overlap(buffer.ranges[r])) {
            // there is a collision; pick an example to return
            return std::max(range.start, buffer.ranges[r].start);
        }
    }

    buffer.ranges.push_back(range);

    return -1;  // no collision
}